

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

error_t parse_opt(int key,char *arg,argp_state *state)

{
  arg_data *data;
  argp_state *state_local;
  char *arg_local;
  int key_local;
  
  if (key == 99) {
    *(char **)state->input = arg;
    arg_local._4_4_ = 0;
  }
  else {
    arg_local._4_4_ = 7;
  }
  return arg_local._4_4_;
}

Assistant:

static error_t
parse_opt (int key, char *arg, struct argp_state *state)
{
    struct arg_data *data = (struct arg_data *)state->input;
    switch (key)
    {
    case 'c':
        data->config_file = arg;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}